

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<true>::Int(VWReaderHandler<true> *this,int v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ESI;
  Context<true> *in_RDI;
  
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[2])((float)in_ESI);
  bVar1 = Context<true>::TransitionState(in_RDI,(BaseState<true> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Int(int v) { return ctx.TransitionState(ctx.current_state->Float(ctx, (float)v)); }